

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

double ChickenHook::log(double __x)

{
  code *pcVar1;
  char in_AL;
  void *in_RDI;
  undefined1 local_138 [48];
  double local_108;
  string local_80 [52];
  int local_4c;
  string local_48 [4];
  int len;
  string res;
  undefined1 local_28 [8];
  va_list argptr;
  char *CFormatString_local;
  
  if (in_AL != '\0') {
    local_108 = __x;
  }
  if ((in_RDI != (void *)0x0) && (logFunction_abi_cxx11_ != (code *)0x0)) {
    argptr[0].overflow_arg_area = local_138;
    argptr[0]._0_8_ = &stack0x00000008;
    local_28._4_4_ = 0x30;
    local_28._0_4_ = 8;
    argptr[0].reg_save_area = in_RDI;
    std::__cxx11::string::string(local_48);
    local_4c = vaListToString((char *)argptr[0].reg_save_area,(__va_list_tag *)local_28,
                              (string *)local_48);
    pcVar1 = logFunction_abi_cxx11_;
    if (0 < local_4c) {
      std::__cxx11::string::string(local_80,local_48);
      (*pcVar1)(local_80);
      std::__cxx11::string::~string(local_80);
    }
    __x = (double)std::__cxx11::string::~string(local_48);
  }
  return __x;
}

Assistant:

void log(const char *CFormatString, ...) {

        if (CFormatString == nullptr) {
            return;
        }

        if (logFunction == NULL) {
            return;
        }

        va_list argptr;
        va_start(argptr, CFormatString);
        std::string res;
        int len = vaListToString(CFormatString, argptr, res);
        if (len > 0) {
            (*logFunction)(res);
        }
        va_end(argptr);

    }